

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

char * re2::TerminateNumber(char *buf,int nbuf,char *str,int *np,bool accept_spaces)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int local_38;
  bool neg;
  int n;
  bool accept_spaces_local;
  int *np_local;
  char *str_local;
  int nbuf_local;
  char *buf_local;
  
  local_38 = *np;
  if (local_38 < 1) {
    buf_local = "";
  }
  else {
    np_local = (int *)str;
    if ((0 < local_38) && (iVar1 = isspace((int)*str), iVar1 != 0)) {
      if (!accept_spaces) {
        buf_local = "";
        return buf_local;
      }
      while( true ) {
        bVar2 = false;
        if (0 < local_38) {
          iVar1 = isspace((int)(char)*np_local);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        local_38 = local_38 + -1;
        np_local = (int *)((long)np_local + 1);
      }
    }
    bVar2 = false;
    if ((0 < local_38) && ((char)*np_local == '-')) {
      bVar2 = true;
      local_38 = local_38 + -1;
      np_local = (int *)((long)np_local + 1);
    }
    if (((2 < local_38) && ((char)*np_local == '0')) && (*(char *)((long)np_local + 1) == '0')) {
      while( true ) {
        bVar3 = false;
        if (2 < local_38) {
          bVar3 = *(char *)((long)np_local + 2) == '0';
        }
        if (!bVar3) break;
        local_38 = local_38 + -1;
        np_local = (int *)((long)np_local + 1);
      }
    }
    if (bVar2) {
      local_38 = local_38 + 1;
      np_local = (int *)((long)np_local + -1);
    }
    if (nbuf + -1 < local_38) {
      buf_local = "";
    }
    else {
      memmove(buf,np_local,(long)local_38);
      if (bVar2) {
        *buf = '-';
      }
      buf[local_38] = '\0';
      *np = local_38;
      buf_local = buf;
    }
  }
  return buf_local;
}

Assistant:

static const char* TerminateNumber(char* buf, int nbuf, const char* str, int* np,
                                   bool accept_spaces) {
  int n = *np;
  if (n <= 0) return "";
  if (n > 0 && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces. We do allow leading spaces for floats.
    if (!accept_spaces) {
      return "";
    }
    while (n > 0 && isspace(*str)) {
      n--;
      str++;
    }
  }

  // Although buf has a fixed maximum size, we can still handle
  // arbitrarily large integers correctly by omitting leading zeros.
  // (Numbers that are still too long will be out of range.)
  // Before deciding whether str is too long,
  // remove leading zeros with s/000+/00/.
  // Leaving the leading two zeros in place means that
  // we don't change 0000x123 (invalid) into 0x123 (valid).
  // Skip over leading - before replacing.
  bool neg = false;
  if (n >= 1 && str[0] == '-') {
    neg = true;
    n--;
    str++;
  }

  if (n >= 3 && str[0] == '0' && str[1] == '0') {
    while (n >= 3 && str[2] == '0') {
      n--;
      str++;
    }
  }

  if (neg) {  // make room in buf for -
    n++;
    str--;
  }

  if (n > nbuf-1) return "";

  memmove(buf, str, n);
  if (neg) {
    buf[0] = '-';
  }
  buf[n] = '\0';
  *np = n;
  return buf;
}